

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,BamAlignment *alignment,string *dna,string *qualities,
          string *nucigar,vector<char,_std::allocator<char>_> *cigar_temp_unrolled,int *c_pos1,
          int *c_pos2,int *q_pos1,int *q_pos2,int *ref_pos)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  char local_5a;
  char local_59;
  ulong local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  BamAlignment *local_38;
  
  bVar1 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[*c_pos1];
  bVar2 = (cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_start[*c_pos2];
  cVar4 = (char)nucigar;
  local_38 = alignment;
  if (bVar2 == 0x4d && bVar1 == 0x4d) {
LAB_0018e207:
    local_59 = ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
    local_5a = ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
    computeEntry(&local_59,&local_5a,(char *)(*(long *)(local_38 + 0x28) + (long)*q_pos2),
                 (char *)((long)*q_pos2 + *(long *)(local_38 + 0x68)));
    std::__cxx11::string::push_back((char)dna);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back(cVar4);
    if (bVar1 != 0x49) {
LAB_0018e2c2:
      *ref_pos = *ref_pos + 1;
    }
    *q_pos1 = *q_pos1 + 1;
    *q_pos2 = *q_pos2 + 1;
    *c_pos1 = *c_pos1 + 1;
    goto LAB_0018e2d1;
  }
  if ((bVar1 == 0x53) && (bVar2 == 0x53)) goto LAB_0018e2c2;
  if ((bVar1 == 0x49) && (bVar2 == 0x49)) goto LAB_0018e207;
  local_50 = dna;
  local_48 = qualities;
  local_40 = nucigar;
  if ((bVar1 == 0x44) && (bVar2 == 0x44)) {
LAB_0018e30d:
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    *ref_pos = *ref_pos + 1;
    if ((bVar1 == 0x44) || (bVar2 == 0x44)) {
      std::__cxx11::string::push_back(cVar4);
    }
    c_pos2 = q_pos1;
    piVar3 = q_pos2;
    if (bVar1 == 0x53) goto LAB_0018e2d1;
  }
  else {
    local_58 = (ulong)bVar2;
    bVar5 = bVar1 == 0x44;
    bVar6 = bVar1 == 0x48;
    if (((bVar6 || bVar5) && bVar2 == 0x48) ||
       (((bVar6 && bVar2 == 0x44 || (bVar5 && bVar2 == 0x53)) || (bVar1 == 0x53 && bVar2 == 0x44))))
    goto LAB_0018e30d;
    if (((bVar1 == 0x4d) && (bVar2 - 0x44 < 0x10)) && ((0x8011U >> (bVar2 - 0x44 & 0x1f) & 1) != 0))
    {
LAB_0018e481:
      std::__cxx11::string::push_back(cVar4);
      ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
      std::__cxx11::string::push_back((char)local_50);
      ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
      std::__cxx11::string::push_back((char)local_48);
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos1 = *q_pos1 + 1;
      c_pos2 = q_pos2;
      if ((int)local_58 != 0x53) {
        return;
      }
      goto LAB_0018e2d1;
    }
    if ((((!bVar6 && !bVar5) && bVar1 != 0x53 || bVar2 != 0x4d) && (bVar1 != 0x53 || bVar2 != 0x48))
       && (bVar2 != 0x53 || bVar1 != 0x48)) {
      if ((bVar1 != 0x49) && (bVar2 != 0x49)) {
        return;
      }
      std::__cxx11::string::push_back(cVar4);
      if (bVar1 == 0x49) {
        ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
        std::__cxx11::string::push_back((char)local_50);
        ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
        std::__cxx11::string::push_back((char)local_48);
        *c_pos1 = *c_pos1 + 1;
        c_pos2 = q_pos1;
      }
      else {
        std::__cxx11::string::push_back((char)local_50);
        std::__cxx11::string::push_back((char)local_48);
        *c_pos2 = *c_pos2 + 1;
        c_pos2 = q_pos2;
      }
      goto LAB_0018e2d1;
    }
    if (bVar1 == 0x4d) goto LAB_0018e481;
    if (bVar2 != 0x4d) {
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      c_pos2 = q_pos2;
      if (bVar1 == 0x53) {
        c_pos2 = q_pos1;
      }
      goto LAB_0018e2d1;
    }
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back((char)local_50);
    std::__cxx11::string::push_back((char)local_48);
    *ref_pos = *ref_pos + 1;
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    *q_pos2 = *q_pos2 + 1;
    piVar3 = q_pos1;
    bVar2 = bVar1;
  }
  c_pos2 = piVar3;
  if (bVar2 != 0x53) {
    return;
  }
LAB_0018e2d1:
  *c_pos2 = *c_pos2 + 1;
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(const BamTools::BamAlignment& alignment, std::string& dna, std::string& qualities, std::string& nucigar, std::vector<char>& cigar_temp_unrolled, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos) const{
    char c1 = this->cigar1_unrolled[c_pos1];
    char c2 = cigar_temp_unrolled[c_pos2];
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){
        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry(this->sequence1[q_pos1],this->sequence1.qualityChar(q_pos1),alignment.QueryBases[q_pos2],alignment.Qualities[q_pos2]);
            dna += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
        }
        if (c1 != 'I') ref_pos++;
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){
        c_pos1++;
        c_pos2++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {
        if (c1 == 'M'){
            nucigar += 'M';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){
        if(c1 == 'I'){
            nucigar += 'I';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            c_pos2++;
            q_pos2++;
        }
    } else {
        assert(false);
    }
}